

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O1

void ss_swapmerge(sauchar_t *T,saidx_t *PA,saidx_t *first,saidx_t *middle,saidx_t *last,saidx_t *buf
                 ,saidx_t bufsize,saidx_t depth)

{
  uint *puVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  int iVar7;
  uint *puVar8;
  byte *pbVar9;
  uint *puVar10;
  ulong uVar11;
  ulong uVar12;
  uint *puVar13;
  uint *puVar14;
  sauchar_t *psVar15;
  int *piVar16;
  uint uVar17;
  byte *pbVar18;
  uint *puVar19;
  sauchar_t *psVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  byte *pbVar24;
  long lVar25;
  bool bVar26;
  bool bVar27;
  uint local_49c;
  uint *local_498;
  int *local_488;
  undefined8 local_458 [3];
  uint local_440 [2];
  undefined8 local_438 [3];
  uint auStack_420 [252];
  
  lVar25 = (long)depth;
  iVar22 = 0;
  local_49c = 0;
  local_498 = (uint *)last;
LAB_001034c4:
  uVar11 = (long)local_498 - (long)middle;
  uVar23 = (long)uVar11 >> 2;
  if ((long)uVar23 <= (long)bufsize) {
    if ((middle < local_498) && (first < middle)) {
      iVar7 = (int)(uVar11 >> 2);
      if (0 < iVar7) {
        iVar7 = iVar7 + 1;
        lVar21 = 0;
        do {
          uVar3 = *(undefined4 *)((long)buf + lVar21);
          *(undefined4 *)((long)buf + lVar21) = *(undefined4 *)((long)middle + lVar21);
          *(undefined4 *)((long)middle + lVar21) = uVar3;
          lVar21 = lVar21 + 4;
          iVar7 = iVar7 + -1;
        } while (1 < iVar7);
      }
      puVar13 = (uint *)((long)buf + (uVar11 - 4));
      uVar17 = *puVar13;
      uVar6 = (int)uVar17 >> 0x1f;
      local_488 = PA + (uVar6 ^ uVar17);
      puVar14 = (uint *)middle + -1;
      uVar17 = (int)((uint *)middle)[-1] >> 0x1f;
      uVar6 = uVar17 * -2 - uVar6;
      piVar16 = PA + (uVar17 ^ ((uint *)middle)[-1]);
      puVar10 = local_498 + -1;
      uVar17 = local_498[-1];
LAB_001037b8:
      pbVar9 = T + *local_488 + lVar25;
      pbVar24 = T + *piVar16 + lVar25;
      pbVar18 = T + (long)piVar16[1] + 2;
      bVar26 = pbVar24 < pbVar18;
      bVar27 = pbVar9 < T + (long)local_488[1] + 2;
      if ((bVar27) && (pbVar24 < pbVar18)) {
        bVar27 = true;
        bVar26 = true;
        if (*pbVar9 == *pbVar24) {
          psVar15 = T + (long)*piVar16 + 1;
          psVar20 = T + (long)*local_488 + 1;
          do {
            pbVar9 = psVar20 + lVar25;
            pbVar24 = psVar15 + lVar25;
            bVar26 = pbVar24 < pbVar18;
            bVar27 = pbVar9 < T + (long)local_488[1] + 2;
            if ((!bVar27) || (pbVar18 <= pbVar24)) goto LAB_00103848;
            psVar15 = psVar15 + 1;
            psVar20 = psVar20 + 1;
          } while (*pbVar9 == *pbVar24);
          bVar27 = true;
          bVar26 = true;
        }
      }
LAB_00103848:
      if (bVar27) {
        iVar7 = 1;
        if (bVar26 != false) {
          iVar7 = (uint)*pbVar9 - (uint)*pbVar24;
        }
      }
      else {
        iVar7 = -(uint)bVar26;
      }
      puVar8 = (uint *)buf;
      if (0 < iVar7) {
        if ((uVar6 & 1) != 0) {
          do {
            *puVar10 = *puVar13;
            puVar5 = puVar10 + -1;
            puVar10 = puVar10 + -1;
            *puVar13 = *puVar5;
            puVar5 = puVar13 + -1;
            puVar13 = puVar13 + -1;
          } while ((int)*puVar5 < 0);
          uVar6 = uVar6 & 0xfffffffe;
        }
        *puVar10 = *puVar13;
        if (puVar13 <= buf) goto LAB_00103e49;
        puVar10 = puVar10 + -1;
        *puVar13 = *puVar10;
        uVar2 = puVar13[-1];
        if ((long)(int)uVar2 < 0) {
          local_488 = PA + ~uVar2;
          uVar6 = uVar6 | 1;
          puVar13 = puVar13 + -1;
        }
        else {
          local_488 = PA + (int)uVar2;
          puVar13 = puVar13 + -1;
        }
        goto LAB_001037b8;
      }
      if (iVar7 < 0) {
        if ((uVar6 & 2) != 0) {
          do {
            *puVar10 = *puVar14;
            puVar8 = puVar10 + -1;
            puVar10 = puVar10 + -1;
            *puVar14 = *puVar8;
            puVar8 = puVar14 + -1;
            puVar14 = puVar14 + -1;
          } while ((int)*puVar8 < 0);
          uVar6 = uVar6 & 0xfffffffd;
        }
        *puVar10 = *puVar14;
        puVar8 = puVar10 + -1;
        puVar10 = puVar10 + -1;
        *puVar14 = *puVar8;
        puVar14 = puVar14 + -1;
        if (puVar14 < first) goto joined_r0x00103e00;
        uVar2 = *puVar14;
        uVar4 = ~uVar2;
        if (-1 < (int)uVar2) {
          uVar4 = uVar2;
        }
        if (-1 >= (int)uVar2) {
          uVar6 = uVar6 | 2;
        }
        piVar16 = PA + uVar4;
        goto LAB_001037b8;
      }
      if ((uVar6 & 1) != 0) {
        do {
          *puVar10 = *puVar13;
          puVar5 = puVar10 + -1;
          puVar10 = puVar10 + -1;
          *puVar13 = *puVar5;
          puVar5 = puVar13 + -1;
          puVar13 = puVar13 + -1;
        } while ((int)*puVar5 < 0);
        uVar6 = uVar6 & 0xfffffffe;
      }
      *puVar10 = ~*puVar13;
      if (buf < puVar13) {
        puVar8 = puVar10 + -1;
        *puVar13 = puVar10[-1];
        if ((uVar6 & 2) != 0) {
          do {
            *puVar8 = *puVar14;
            puVar10 = puVar8 + -1;
            puVar8 = puVar8 + -1;
            *puVar14 = *puVar10;
            puVar10 = puVar14 + -1;
            puVar14 = puVar14 + -1;
          } while ((int)*puVar10 < 0);
          uVar6 = uVar6 & 0xfffffffd;
        }
        puVar13 = puVar13 + -1;
        *puVar8 = *puVar14;
        puVar10 = puVar8 + -1;
        *puVar14 = puVar8[-1];
        puVar14 = puVar14 + -1;
        if (puVar14 < first) goto joined_r0x001042d5;
        uVar2 = *puVar13;
        uVar6 = uVar2 >> 0x1f | uVar6;
        local_488 = PA + ((int)uVar2 >> 0x1f ^ uVar2);
        uVar2 = *puVar14;
        if ((long)(int)uVar2 < 0) {
          piVar16 = PA + ~uVar2;
          uVar6 = uVar6 | 2;
        }
        else {
          piVar16 = PA + (int)uVar2;
        }
        goto LAB_001037b8;
      }
      goto LAB_00103e49;
    }
    goto LAB_00103e4c;
  }
  uVar12 = (long)middle - (long)first;
  uVar11 = (long)uVar12 >> 2;
  if ((long)uVar11 <= (long)bufsize) {
    if (first < middle) {
      iVar7 = (int)(uVar12 >> 2);
      if (0 < iVar7) {
        iVar7 = iVar7 + 1;
        lVar21 = 0;
        do {
          uVar3 = *(undefined4 *)((long)buf + lVar21);
          *(undefined4 *)((long)buf + lVar21) = *(undefined4 *)((long)first + lVar21);
          *(undefined4 *)((long)first + lVar21) = uVar3;
          lVar21 = lVar21 + 4;
          iVar7 = iVar7 + -1;
        } while (1 < iVar7);
      }
      puVar14 = (uint *)((long)buf + (uVar12 - 4));
      uVar6 = *first;
      puVar10 = (uint *)buf;
      puVar13 = (uint *)first;
LAB_00103a7f:
      do {
        uVar17 = *middle;
        pbVar9 = T + PA[(int)*puVar10] + lVar25;
        pbVar24 = T + PA[(int)uVar17] + lVar25;
        pbVar18 = T + (long)PA[(long)(int)uVar17 + 1] + 2;
        bVar26 = pbVar24 < pbVar18;
        bVar27 = pbVar9 < T + (long)PA[(long)(int)*puVar10 + 1] + 2;
        if ((bVar27) && (pbVar24 < pbVar18)) {
          bVar27 = true;
          bVar26 = true;
          if (*pbVar9 == *pbVar24) {
            psVar15 = T + (long)PA[(int)uVar17] + 1;
            psVar20 = T + (long)PA[(int)*puVar10] + 1;
            do {
              pbVar9 = psVar20 + lVar25;
              pbVar24 = psVar15 + lVar25;
              bVar26 = pbVar24 < pbVar18;
              bVar27 = pbVar9 < T + (long)PA[(long)(int)*puVar10 + 1] + 2;
              if ((!bVar27) || (pbVar18 <= pbVar24)) goto LAB_00103b12;
              psVar15 = psVar15 + 1;
              psVar20 = psVar20 + 1;
            } while (*pbVar9 == *pbVar24);
            bVar27 = true;
            bVar26 = true;
          }
        }
LAB_00103b12:
        if (bVar27) {
          iVar7 = 1;
          if (bVar26 != false) {
            iVar7 = (uint)*pbVar9 - (uint)*pbVar24;
          }
        }
        else {
          iVar7 = -(uint)bVar26;
        }
        puVar8 = puVar10;
        if (iVar7 < 0) {
          do {
            *puVar13 = *puVar8;
            if (puVar14 <= puVar8) goto LAB_00104105;
            puVar5 = puVar13 + 1;
            puVar13 = puVar13 + 1;
            puVar10 = puVar8 + 1;
            *puVar8 = *puVar5;
            puVar5 = puVar8 + 1;
            puVar8 = puVar10;
          } while ((int)*puVar5 < 0);
          goto LAB_00103a7f;
        }
        puVar8 = puVar13;
        if (iVar7 == 0) {
          *middle = ~uVar17;
          puVar8 = puVar10;
          puVar5 = puVar13 + 2;
          do {
            puVar19 = puVar5;
            *puVar13 = *puVar8;
            if (puVar14 <= puVar8) goto LAB_00104105;
            puVar5 = puVar13 + 1;
            puVar13 = puVar13 + 1;
            puVar10 = puVar8 + 1;
            *puVar8 = *puVar5;
            puVar1 = puVar8 + 1;
            puVar8 = puVar10;
            puVar5 = puVar19 + 1;
          } while ((int)*puVar1 < 0);
          do {
            puVar13 = puVar19;
            puVar13[-1] = *middle;
            *middle = *puVar13;
            middle = (saidx_t *)((uint *)middle + 1);
            if (local_498 <= middle) goto joined_r0x001040c3;
            puVar19 = puVar13 + 1;
          } while (*middle < 0);
        }
        else {
          do {
            puVar13 = puVar8 + 1;
            *puVar8 = *middle;
            *middle = *puVar13;
            middle = (saidx_t *)((uint *)middle + 1);
            if (local_498 <= middle) goto joined_r0x00103f15;
            puVar8 = puVar13;
          } while (*middle < 0);
        }
      } while( true );
    }
    goto LAB_00104108;
  }
  if ((long)uVar11 < (long)uVar23) {
    uVar23 = uVar11;
  }
  uVar6 = 0;
  iVar7 = (int)uVar23;
  while (0 < iVar7) {
    uVar17 = (uint)uVar23;
    uVar23 = uVar23 >> 1 & 0x7fffffff;
    uVar11 = (ulong)((int)((uint *)middle)[(long)(int)uVar6 + uVar23] >> 0x1f ^
                    ((uint *)middle)[(long)(int)uVar6 + uVar23]);
    uVar12 = (ulong)((int)((uint *)middle)[(-1 - uVar23) - (long)(int)uVar6] >> 0x1f ^
                    ((uint *)middle)[(-1 - uVar23) - (long)(int)uVar6]);
    pbVar9 = T + PA[uVar11] + lVar25;
    pbVar24 = T + PA[uVar12] + lVar25;
    pbVar18 = T + (long)PA[uVar12 + 1] + 2;
    bVar26 = pbVar24 < pbVar18;
    bVar27 = pbVar9 < T + (long)PA[uVar11 + 1] + 2;
    if (((bVar27) && (pbVar24 < pbVar18)) && (*pbVar9 == *pbVar24)) {
      psVar20 = T + (long)PA[uVar12] + 1;
      psVar15 = T + (long)PA[uVar11] + 1;
      do {
        pbVar9 = psVar15 + lVar25;
        pbVar24 = psVar20 + lVar25;
        bVar26 = pbVar24 < pbVar18;
        bVar27 = pbVar9 < T + (long)PA[uVar11 + 1] + 2;
        if ((!bVar27) || (pbVar18 <= pbVar24)) break;
        psVar20 = psVar20 + 1;
        psVar15 = psVar15 + 1;
      } while (*pbVar9 == *pbVar24);
    }
    if (bVar27) {
      if (bVar26) {
        bVar26 = *pbVar9 < *pbVar24;
        goto LAB_001035d3;
      }
    }
    else {
LAB_001035d3:
      if (bVar26) {
        uVar6 = uVar6 + (int)uVar23 + 1;
        uVar23 = (ulong)((int)uVar23 - (~uVar17 & 1));
      }
    }
    iVar7 = (int)uVar23;
  }
  if (0 < (int)uVar6) goto code_r0x001035f9;
  uVar23 = (ulong)((int)((uint *)middle)[-1] >> 0x1f ^ ((uint *)middle)[-1]);
  uVar6 = *middle;
  pbVar9 = T + PA[uVar23] + lVar25;
  pbVar24 = T + PA[(int)uVar6] + lVar25;
  pbVar18 = T + (long)PA[(long)(int)uVar6 + 1] + 2;
  bVar26 = pbVar24 < pbVar18;
  bVar27 = pbVar9 < T + (long)PA[uVar23 + 1] + 2;
  if (((bVar27) && (pbVar24 < pbVar18)) && (*pbVar9 == *pbVar24)) {
    psVar20 = T + (long)PA[(int)uVar6] + 1;
    psVar15 = T + (long)PA[uVar23] + 1;
    do {
      pbVar9 = psVar15 + lVar25;
      pbVar24 = psVar20 + lVar25;
      bVar26 = pbVar24 < pbVar18;
      bVar27 = pbVar9 < T + (long)PA[uVar23 + 1] + 2;
      if ((!bVar27) || (pbVar18 <= pbVar24)) break;
      psVar20 = psVar20 + 1;
      psVar15 = psVar15 + 1;
    } while (*pbVar9 == *pbVar24);
  }
  if (bVar27) {
    iVar7 = 1;
    if (bVar26 != false) {
      iVar7 = (uint)*pbVar9 - (uint)*pbVar24;
    }
  }
  else {
    iVar7 = -(uint)bVar26;
  }
  if (iVar7 == 0) {
    *middle = ~uVar6;
  }
  if ((local_49c & 1) == 0) {
    if ((local_49c & 2) != 0) {
      uVar23 = (ulong)((int)((uint *)first)[-1] >> 0x1f ^ ((uint *)first)[-1]);
      pbVar9 = T + PA[uVar23] + lVar25;
      pbVar24 = T + PA[*first] + lVar25;
      pbVar18 = T + (long)PA[(long)*first + 1] + 2;
      bVar26 = pbVar24 < pbVar18;
      bVar27 = pbVar9 < T + (long)PA[uVar23 + 1] + 2;
      if (((bVar27) && (pbVar24 < pbVar18)) && (*pbVar9 == *pbVar24)) {
        psVar20 = T + (long)PA[*first] + 1;
        psVar15 = T + (long)PA[uVar23] + 1;
        do {
          pbVar9 = psVar15 + lVar25;
          pbVar24 = psVar20 + lVar25;
          bVar26 = pbVar24 < pbVar18;
          bVar27 = pbVar9 < T + (long)PA[uVar23 + 1] + 2;
          if ((!bVar27) || (pbVar18 <= pbVar24)) break;
          psVar20 = psVar20 + 1;
          psVar15 = psVar15 + 1;
        } while (*pbVar9 == *pbVar24);
      }
      if (bVar27) {
        iVar7 = 1;
        if (bVar26 != false) {
          iVar7 = (uint)*pbVar9 - (uint)*pbVar24;
        }
      }
      else {
        iVar7 = -(uint)bVar26;
      }
      if (iVar7 == 0) goto LAB_00104008;
    }
  }
  else {
LAB_00104008:
    *first = ~*first;
  }
  if ((local_49c & 4) != 0) {
    uVar23 = (ulong)((int)local_498[-1] >> 0x1f ^ local_498[-1]);
    uVar6 = *local_498;
    pbVar9 = T + PA[uVar23] + lVar25;
    pbVar24 = T + PA[(int)uVar6] + lVar25;
    pbVar18 = T + (long)PA[(long)(int)uVar6 + 1] + 2;
    bVar27 = pbVar24 < pbVar18;
    bVar26 = pbVar9 < T + (long)PA[uVar23 + 1] + 2;
    if (((bVar26) && (pbVar24 < pbVar18)) && (*pbVar9 == *pbVar24)) {
      psVar20 = T + (long)PA[(int)uVar6] + 1;
      psVar15 = T + (long)PA[uVar23] + 1;
      do {
        pbVar9 = psVar15 + lVar25;
        pbVar24 = psVar20 + lVar25;
        bVar27 = pbVar24 < pbVar18;
        bVar26 = pbVar9 < T + (long)PA[uVar23 + 1] + 2;
        if ((!bVar26) || (pbVar18 <= pbVar24)) break;
        psVar20 = psVar20 + 1;
        psVar15 = psVar15 + 1;
      } while (*pbVar9 == *pbVar24);
    }
    goto joined_r0x001040a7;
  }
  goto LAB_00104296;
joined_r0x00103e00:
  for (; buf < puVar13; puVar13 = puVar13 + -1) {
    *puVar10 = *puVar13;
    *puVar13 = puVar10[-1];
    puVar10 = puVar10 + -1;
  }
  goto LAB_00103e45;
joined_r0x001042d5:
  for (; buf < puVar13; puVar13 = puVar13 + -1) {
    *puVar10 = *puVar13;
    *puVar13 = puVar10[-1];
    puVar10 = puVar10 + -1;
  }
LAB_00103e45:
  *puVar10 = *puVar13;
  puVar8 = puVar13;
LAB_00103e49:
  *puVar8 = uVar17;
LAB_00103e4c:
  if ((local_49c & 1) == 0) {
    if ((local_49c & 2) != 0) {
      uVar23 = (ulong)((int)((uint *)first)[-1] >> 0x1f ^ ((uint *)first)[-1]);
      pbVar9 = T + PA[uVar23] + lVar25;
      pbVar24 = T + PA[*first] + lVar25;
      pbVar18 = T + (long)PA[(long)*first + 1] + 2;
      bVar26 = pbVar24 < pbVar18;
      bVar27 = pbVar9 < T + (long)PA[uVar23 + 1] + 2;
      if (((bVar27) && (pbVar24 < pbVar18)) && (*pbVar9 == *pbVar24)) {
        psVar20 = T + (long)PA[*first] + 1;
        psVar15 = T + (long)PA[uVar23] + 1;
        do {
          pbVar9 = psVar15 + lVar25;
          pbVar24 = psVar20 + lVar25;
          bVar26 = pbVar24 < pbVar18;
          bVar27 = pbVar9 < T + (long)PA[uVar23 + 1] + 2;
          if ((!bVar27) || (pbVar18 <= pbVar24)) break;
          psVar20 = psVar20 + 1;
          psVar15 = psVar15 + 1;
        } while (*pbVar9 == *pbVar24);
      }
      if (bVar27) {
        iVar7 = 1;
        if (bVar26 != false) {
          iVar7 = (uint)*pbVar9 - (uint)*pbVar24;
        }
      }
      else {
        iVar7 = -(uint)bVar26;
      }
      if (iVar7 == 0) goto LAB_00103f4a;
    }
  }
  else {
LAB_00103f4a:
    *first = ~*first;
  }
  if ((local_49c & 4) == 0) goto LAB_00104296;
  uVar23 = (ulong)((int)local_498[-1] >> 0x1f ^ local_498[-1]);
  uVar6 = *local_498;
  pbVar9 = T + PA[uVar23] + lVar25;
  pbVar24 = T + PA[(int)uVar6] + lVar25;
  pbVar18 = T + (long)PA[(long)(int)uVar6 + 1] + 2;
  bVar27 = pbVar24 < pbVar18;
  bVar26 = pbVar9 < T + (long)PA[uVar23 + 1] + 2;
  if (((bVar26) && (pbVar24 < pbVar18)) && (*pbVar9 == *pbVar24)) {
    psVar20 = T + (long)PA[(int)uVar6] + 1;
    psVar15 = T + (long)PA[uVar23] + 1;
    do {
      pbVar9 = psVar15 + lVar25;
      pbVar24 = psVar20 + lVar25;
      bVar27 = pbVar24 < pbVar18;
      bVar26 = pbVar9 < T + (long)PA[uVar23 + 1] + 2;
      if ((!bVar26) || (pbVar18 <= pbVar24)) break;
      psVar20 = psVar20 + 1;
      psVar15 = psVar15 + 1;
    } while (*pbVar9 == *pbVar24);
  }
  goto joined_r0x001040a7;
joined_r0x001040c3:
  for (; puVar10 < puVar14; puVar10 = puVar10 + 1) {
    *puVar13 = *puVar10;
    *puVar10 = puVar13[1];
    puVar13 = puVar13 + 1;
  }
  goto LAB_001040fe;
joined_r0x00103f15:
  for (; puVar10 < puVar14; puVar10 = puVar10 + 1) {
    *puVar13 = *puVar10;
    *puVar10 = puVar13[1];
    puVar13 = puVar13 + 1;
  }
LAB_001040fe:
  *puVar13 = *puVar10;
  puVar14 = puVar10;
LAB_00104105:
  *puVar14 = uVar6;
LAB_00104108:
  if ((local_49c & 1) == 0) {
    if ((local_49c & 2) != 0) {
      uVar23 = (ulong)((int)((uint *)first)[-1] >> 0x1f ^ ((uint *)first)[-1]);
      pbVar9 = T + PA[uVar23] + lVar25;
      pbVar24 = T + PA[*first] + lVar25;
      pbVar18 = T + (long)PA[(long)*first + 1] + 2;
      bVar26 = pbVar24 < pbVar18;
      bVar27 = pbVar9 < T + (long)PA[uVar23 + 1] + 2;
      if (((bVar27) && (pbVar24 < pbVar18)) && (*pbVar9 == *pbVar24)) {
        psVar20 = T + (long)PA[*first] + 1;
        psVar15 = T + (long)PA[uVar23] + 1;
        do {
          pbVar9 = psVar15 + lVar25;
          pbVar24 = psVar20 + lVar25;
          bVar26 = pbVar24 < pbVar18;
          bVar27 = pbVar9 < T + (long)PA[uVar23 + 1] + 2;
          if ((!bVar27) || (pbVar18 <= pbVar24)) break;
          psVar20 = psVar20 + 1;
          psVar15 = psVar15 + 1;
        } while (*pbVar9 == *pbVar24);
      }
      if (bVar27) {
        iVar7 = 1;
        if (bVar26 != false) {
          iVar7 = (uint)*pbVar9 - (uint)*pbVar24;
        }
      }
      else {
        iVar7 = -(uint)bVar26;
      }
      if (iVar7 == 0) goto LAB_001041d3;
    }
  }
  else {
LAB_001041d3:
    *first = ~*first;
  }
  if ((local_49c & 4) != 0) {
    uVar23 = (ulong)((int)local_498[-1] >> 0x1f ^ local_498[-1]);
    uVar6 = *local_498;
    pbVar9 = T + PA[uVar23] + lVar25;
    pbVar24 = T + PA[(int)uVar6] + lVar25;
    pbVar18 = T + (long)PA[(long)(int)uVar6 + 1] + 2;
    bVar27 = pbVar24 < pbVar18;
    bVar26 = pbVar9 < T + (long)PA[uVar23 + 1] + 2;
    if (((bVar26) && (pbVar24 < pbVar18)) && (*pbVar9 == *pbVar24)) {
      psVar20 = T + (long)PA[(int)uVar6] + 1;
      psVar15 = T + (long)PA[uVar23] + 1;
      do {
        pbVar9 = psVar15 + lVar25;
        pbVar24 = psVar20 + lVar25;
        bVar27 = pbVar24 < pbVar18;
        bVar26 = pbVar9 < T + (long)PA[uVar23 + 1] + 2;
        if ((!bVar26) || (pbVar18 <= pbVar24)) break;
        psVar20 = psVar20 + 1;
        psVar15 = psVar15 + 1;
      } while (*pbVar9 == *pbVar24);
    }
joined_r0x001040a7:
    if (bVar26) {
      iVar7 = 1;
      if (bVar27 != false) {
        iVar7 = (uint)*pbVar9 - (uint)*pbVar24;
      }
    }
    else {
      iVar7 = -(uint)bVar27;
    }
    if (iVar7 == 0) {
      *local_498 = ~uVar6;
    }
  }
LAB_00104296:
  if (iVar22 == 0) {
    return;
  }
  lVar21 = (long)iVar22;
  iVar22 = iVar22 + -1;
  first = (saidx_t *)local_458[lVar21 * 4];
  middle = (saidx_t *)local_458[lVar21 * 4 + 1];
  local_498 = *(uint **)(local_440 + lVar21 * 8 + -2);
  local_49c = local_440[lVar21 * 8];
  goto LAB_001034c4;
code_r0x001035f9:
  uVar23 = (ulong)uVar6;
  puVar13 = (uint *)middle + -uVar23;
  iVar7 = uVar6 + 1;
  puVar10 = (uint *)middle;
  do {
    uVar6 = puVar10[-uVar23];
    puVar10[-uVar23] = *puVar10;
    *puVar10 = uVar6;
    puVar10 = puVar10 + 1;
    iVar7 = iVar7 + -1;
  } while (1 < iVar7);
  puVar8 = (uint *)middle + uVar23;
  uVar6 = 0;
  puVar14 = (uint *)middle;
  puVar10 = (uint *)middle;
  if (puVar8 < local_498) {
    if ((int)*puVar8 < 0) {
      *puVar8 = ~*puVar8;
      uVar6 = 1;
      if (first < puVar13) {
        do {
          puVar5 = puVar14 + -1;
          puVar14 = puVar14 + -1;
        } while ((int)*puVar5 < 0);
        uVar6 = 5;
      }
    }
    else if (first < puVar13) {
      puVar10 = (uint *)middle + -1;
      do {
        puVar5 = puVar10 + 1;
        puVar10 = puVar10 + 1;
      } while ((int)*puVar5 < 0);
      uVar6 = 2;
    }
  }
  if ((long)local_498 - (long)puVar10 < (long)puVar14 - (long)first) {
    uVar17 = uVar6 ^ 6;
    if ((uVar6 & 2) == 0) {
      uVar17 = uVar6;
    }
    if (puVar10 != (uint *)middle) {
      uVar17 = uVar6;
    }
    lVar21 = (long)iVar22;
    local_438[lVar21 * 4] = first;
    local_438[lVar21 * 4 + 1] = puVar13;
    *(uint **)(auStack_420 + lVar21 * 8 + -2) = puVar14;
    iVar22 = iVar22 + 1;
    auStack_420[lVar21 * 8] = uVar17 & 0xfffffffc | local_49c & 3;
    local_49c = local_49c & 4 | uVar17 & 3;
    first = (saidx_t *)puVar10;
    middle = (saidx_t *)puVar8;
  }
  else {
    lVar21 = (long)iVar22;
    local_438[lVar21 * 4] = puVar10;
    local_438[lVar21 * 4 + 1] = puVar8;
    *(uint **)(auStack_420 + lVar21 * 8 + -2) = local_498;
    iVar22 = iVar22 + 1;
    auStack_420[lVar21 * 8] = local_49c & 4 | uVar6 & 3;
    local_49c = uVar6 & 0xfffffffc | local_49c & 3;
    middle = (saidx_t *)puVar13;
    local_498 = puVar14;
  }
  goto LAB_001034c4;
}

Assistant:

static
void
ss_swapmerge(const sauchar_t *T, const saidx_t *PA,
             saidx_t *first, saidx_t *middle, saidx_t *last,
             saidx_t *buf, saidx_t bufsize, saidx_t depth) {
#define STACK_SIZE SS_SMERGE_STACKSIZE
#define GETIDX(a) ((0 <= (a)) ? (a) : (~(a)))
#define MERGE_CHECK(a, b, c)\
  do {\
    if(((c) & 1) ||\
       (((c) & 2) && (ss_compare(T, PA + GETIDX(*((a) - 1)), PA + *(a), depth) == 0))) {\
      *(a) = ~*(a);\
    }\
    if(((c) & 4) && ((ss_compare(T, PA + GETIDX(*((b) - 1)), PA + *(b), depth) == 0))) {\
      *(b) = ~*(b);\
    }\
  } while(0)
  struct { saidx_t *a, *b, *c; saint_t d; } stack[STACK_SIZE];
  saidx_t *l, *r, *lm, *rm;
  saidx_t m, len, half;
  saint_t ssize;
  saint_t check, next;

  for(check = 0, ssize = 0;;) {
    if((last - middle) <= bufsize) {
      if((first < middle) && (middle < last)) {
        ss_mergebackward(T, PA, first, middle, last, buf, depth);
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
      continue;
    }

    if((middle - first) <= bufsize) {
      if(first < middle) {
        ss_mergeforward(T, PA, first, middle, last, buf, depth);
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
      continue;
    }

    for(m = 0, len = MIN(middle - first, last - middle), half = len >> 1;
        0 < len;
        len = half, half >>= 1) {
      if(ss_compare(T, PA + GETIDX(*(middle + m + half)),
                       PA + GETIDX(*(middle - m - half - 1)), depth) < 0) {
        m += half + 1;
        half -= (len & 1) ^ 1;
      }
    }

    if(0 < m) {
      lm = middle - m, rm = middle + m;
      ss_blockswap(lm, middle, m);
      l = r = middle, next = 0;
      if(rm < last) {
        if(*rm < 0) {
          *rm = ~*rm;
          if(first < lm) { for(; *--l < 0;) { } next |= 4; }
          next |= 1;
        } else if(first < lm) {
          for(; *r < 0; ++r) { }
          next |= 2;
        }
      }

      if((l - first) <= (last - r)) {
        STACK_PUSH(r, rm, last, (next & 3) | (check & 4));
        middle = lm, last = l, check = (check & 3) | (next & 4);
      } else {
        if((next & 2) && (r == middle)) { next ^= 6; }
        STACK_PUSH(first, lm, l, (check & 3) | (next & 4));
        first = r, middle = rm, check = (next & 3) | (check & 4);
      }
    } else {
      if(ss_compare(T, PA + GETIDX(*(middle - 1)), PA + *middle, depth) == 0) {
        *middle = ~*middle;
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
    }
  }
#undef STACK_SIZE
}